

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall
dxil_spv::Converter::Impl::register_resource_meta_reference
          (Impl *this,MDOperand *operand,ResourceType type,uint index)

{
  bool bVar1;
  MetadataKind MVar2;
  ValueKind VVar3;
  uint uVar4;
  Constant *value;
  ConstantExpr *this_00;
  GlobalVariable *this_01;
  mapped_type *pmVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  GlobalVariable *pGVar8;
  GlobalVariable *local_1038;
  undefined5 uStack_1030;
  undefined3 uStack_102b;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  if (operand->kind != None) {
    MVar2 = LLVMBC::MDOperand::get_metadata_kind(operand);
    if (MVar2 != Constant) {
      p_Var6 = get_thread_log_callback();
      if (p_Var6 != (LoggingCallback)0x0) {
        uStack_1028 = 0x6163206e69;
        builtin_strncpy(acStack_1023,"st<T>.\n",8);
        local_1038 = (GlobalVariable *)0x2064696c61766e49;
        uStack_1030 = 0x2065707974;
        uStack_102b = 0x204449;
        pvVar7 = get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,(char *)&local_1038);
        std::terminate();
      }
      register_resource_meta_reference();
      std::terminate();
    }
    value = LLVMBC::ConstantAsMetadata::getValue((ConstantAsMetadata *)operand);
    do {
      if (value == (Constant *)0x0) {
        this_00 = (ConstantExpr *)0x0;
      }
      else {
        this_00 = (ConstantExpr *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
        if (VVar3 != ConstantExpr) {
          this_00 = (ConstantExpr *)0x0;
        }
      }
      if ((this_00 == (ConstantExpr *)0x0) ||
         (uVar4 = LLVMBC::ConstantExpr::getOpcode(this_00), uVar4 != 0x70)) {
        bVar1 = false;
      }
      else {
        value = LLVMBC::ConstantExpr::getOperand(this_00,0);
        bVar1 = true;
      }
    } while (bVar1);
    if (value == (Constant *)0x0) {
      pGVar8 = (GlobalVariable *)0x0;
    }
    else {
      this_01 = (GlobalVariable *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
      VVar3 = LLVMBC::Value::get_value_kind((Value *)this_01);
      pGVar8 = (GlobalVariable *)0x0;
      if (VVar3 == Global) {
        pGVar8 = this_01;
      }
    }
    if (pGVar8 != (GlobalVariable *)0x0) {
      local_1038 = pGVar8;
      pmVar5 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->llvm_global_variable_to_resource_mapping,
                            (key_type *)&local_1038);
      pmVar5->type = type;
      pmVar5->meta_index = index;
      pmVar5->offset = (Value *)0x0;
      pmVar5->variable = pGVar8;
      pmVar5->non_uniform = false;
    }
  }
  return;
}

Assistant:

void Converter::add_local_root_constants(uint32_t register_space, uint32_t register_index, uint32_t num_words)
{
	LocalRootSignatureEntry entry = {};
	entry.type = LocalRootSignatureType::Constants;
	entry.constants.num_words = num_words;
	entry.constants.register_space = register_space;
	entry.constants.register_index = register_index;
	impl->local_root_signature.push_back(entry);
}